

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_DoTimerA(ym3438_t *chip)

{
  bool local_14;
  byte local_13;
  Bit16u local_12;
  Bit8u load;
  Bit16u time;
  ym3438_t *chip_local;
  
  local_13 = chip->timer_a_overflow;
  if (chip->cycles == 2) {
    local_14 = false;
    if (chip->timer_a_load_lock == '\0') {
      local_14 = chip->timer_a_load != '\0';
    }
    local_13 = local_13 | local_14;
    chip->timer_a_load_lock = chip->timer_a_load;
    if (chip->mode_csm == '\0') {
      chip->mode_kon_csm = '\0';
    }
    else {
      chip->mode_kon_csm = local_13;
    }
  }
  if (chip->timer_a_load_latch == '\0') {
    local_12 = chip->timer_a_cnt;
  }
  else {
    local_12 = chip->timer_a_reg;
  }
  chip->timer_a_load_latch = local_13;
  if (((chip->cycles == 1) && (chip->timer_a_load_lock != '\0')) || (chip->mode_test_21[2] != '\0'))
  {
    local_12 = local_12 + 1;
  }
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag =
         chip->timer_a_overflow_flag | chip->timer_a_overflow & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (Bit8u)((int)(uint)local_12 >> 10);
  chip->timer_a_cnt = local_12 & 0x3ff;
  return;
}

Assistant:

void OPN2_DoTimerA(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_a_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_a_load_lock && chip->timer_a_load);
        chip->timer_a_load_lock = chip->timer_a_load;
        if (chip->mode_csm)
        {
            /* CSM KeyOn */
            chip->mode_kon_csm = load;
        }
        else
        {
            chip->mode_kon_csm = 0;
        }
    }
    /* Load counter */
    if (chip->timer_a_load_latch)
    {
        time = chip->timer_a_reg;
    }
    else
    {
        time = chip->timer_a_cnt;
    }
    chip->timer_a_load_latch = load;
    /* Increase counter */
    if ((chip->cycles == 1 && chip->timer_a_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    /* Set overflow flag */
    if (chip->timer_a_reset)
    {
        chip->timer_a_reset = 0;
        chip->timer_a_overflow_flag = 0;
    }
    else
    {
        chip->timer_a_overflow_flag |= chip->timer_a_overflow & chip->timer_a_enable;
    }
    chip->timer_a_overflow = (time >> 10);
    chip->timer_a_cnt = time & 0x3ff;
}